

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O2

string * __thiscall
BayesianGameForDecPOMDPStage::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameForDecPOMDPStage *this)

{
  element_type *peVar1;
  ostream *poVar2;
  stringstream ss;
  string local_1e0;
  element_type *local_1c0;
  shared_count local_1b8;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = std::operator<<(local_1a0,"Bayesian Game for stage t=");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," of a Dec-POMDP");
  std::endl<char,std::char_traits<char>>(poVar2);
  peVar1 = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.px;
  local_1e0._M_string_length =
       (size_type)(this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
  if ((sp_counted_base *)local_1e0._M_string_length != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_1e0._M_string_length)->use_count_ =
         ((sp_counted_base *)local_1e0._M_string_length)->use_count_ + 1;
    UNLOCK();
  }
  local_1e0._M_dataplus._M_p = (pointer)peVar1;
  boost::detail::shared_count::~shared_count((shared_count *)&local_1e0._M_string_length);
  if (peVar1 != (element_type *)0x0) {
    poVar2 = std::operator<<(local_1a0,"Past policy that lead to this BG=");
    local_1c0 = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.px;
    local_1b8.pi_ = (this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn.pi_;
    if (local_1b8.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_1b8.pi_)->use_count_ = (local_1b8.pi_)->use_count_ + 1;
      UNLOCK();
    }
    (*(local_1c0->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
      _vptr_JointPolicy[6])(&local_1e0);
    poVar2 = std::operator<<(poVar2,(string *)&local_1e0);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_1e0);
    boost::detail::shared_count::~shared_count(&local_1b8);
  }
  BayesianGameIdenticalPayoff::SoftPrint_abi_cxx11_
            (&local_1e0,&this->super_BayesianGameIdenticalPayoff);
  std::operator<<(local_1a0,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameForDecPOMDPStage::SoftPrint() const
{
    stringstream ss;
    ss << "Bayesian Game for stage t="<<GetStage()<<" of a Dec-POMDP"<<endl;
    if(GetPastJointPolicy() != 0)
        ss<< "Past policy that lead to this BG=" << GetPastJointPolicy()->SoftPrint()<<endl;
    ss << BayesianGameIdenticalPayoff::SoftPrint();    
    return(ss.str());
}